

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspline_curve.cpp
# Opt level: O2

void __thiscall
embree::PrecomputedBSplineBasis::PrecomputedBSplineBasis(PrecomputedBSplineBasis *this,int dj)

{
  long lVar1;
  size_t j;
  long lVar2;
  float (*pafVar3) [17];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pafVar3 = this->d3;
  for (lVar1 = 1; pafVar3 = pafVar3 + 1, lVar1 != 0x11; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 0x11; lVar2 = lVar2 + 1) {
      fVar4 = (float)(ulong)(dj + lVar2) / (float)lVar1;
      fVar7 = 1.0 - fVar4;
      fVar5 = fVar4 * fVar7;
      fVar6 = fVar7 * fVar7 * fVar7;
      fVar8 = fVar4 * fVar4 * fVar4;
      pafVar3[-0x77][lVar2] = fVar6 * 0.16666667;
      pafVar3[-0x66][lVar2] =
           (fVar7 * fVar5 * 12.0 + fVar4 * fVar5 * 6.0 + fVar6 * 4.0 + fVar8) * 0.16666667;
      pafVar3[-0x55][lVar2] =
           (fVar4 * fVar5 * 12.0 + fVar7 * fVar5 * 6.0 + fVar8 * 4.0 + fVar6) * 0.16666667;
      pafVar3[-0x44][lVar2] = fVar8 * 0.16666667;
      pafVar3[-0x33][lVar2] = -fVar7 * fVar7 * 0.5;
      pafVar3[-0x22][lVar2] = (-fVar4 * fVar4 - fVar5 * 4.0) * 0.5;
      pafVar3[-0x11][lVar2] = (fVar5 * 4.0 + fVar7 * fVar7) * 0.5;
      (*pafVar3)[lVar2] = fVar4 * fVar4 * 0.5;
    }
  }
  return;
}

Assistant:

PrecomputedBSplineBasis::PrecomputedBSplineBasis(int dj)
  {
    for (size_t i=1; i<=N; i++) 
    {
      for (size_t j=0; j<=N; j++) 
      {
        const float u = float(j+dj)/float(i);
        const Vec4f f = BSplineBasis::eval(u);
        c0[i][j] = f.x;
        c1[i][j] = f.y;
        c2[i][j] = f.z;
        c3[i][j] = f.w;
        const Vec4f d = BSplineBasis::derivative(u);
        d0[i][j] = d.x;
        d1[i][j] = d.y;
        d2[i][j] = d.z;
        d3[i][j] = d.w;
      }
    }
  }